

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::DrawTestBase::setup4x4Scissor
          (DrawTestBase *this,SCISSOR_METHOD method,bool set_zeros)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestError *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  GLuint i;
  ulong uVar10;
  GLint data [64];
  int local_138 [66];
  long lVar3;
  
  piVar9 = local_138;
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = 0;
  do {
    (**(code **)(lVar3 + 0x618))(0xc11,iVar1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Enablei",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xc3b);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x10);
  iVar1 = (set_zeros ^ 1) << 5;
  iVar4 = 0;
  iVar5 = 0;
  do {
    iVar6 = iVar4 * 4;
    iVar4 = iVar4 + 4;
    iVar7 = 0;
    iVar8 = 0;
    do {
      local_138[iVar6 + iVar8] = iVar7;
      local_138[iVar6 + iVar8 + 1] = iVar5 << 5;
      local_138[iVar6 + 2 + iVar8] = iVar1;
      local_138[iVar6 + 3 + iVar8] = iVar1;
      iVar8 = iVar8 + 4;
      iVar7 = iVar7 + 0x20;
    } while (iVar8 != 0x10);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 4);
  if (method == SCISSORARRAYV) {
    (**(code **)(lVar3 + 0x1298))(0,0x10,local_138);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"ScissorArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xc5d);
  }
  else if (method == SCISSORINDEXEDF) {
    piVar9 = local_138 + 3;
    uVar10 = 0;
    do {
      (**(code **)(lVar3 + 0x12a0))(uVar10 & 0xffffffff,piVar9[-3],piVar9[-2],piVar9[-1],*piVar9);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"ScissorIndexed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xc68);
      uVar10 = uVar10 + 1;
      piVar9 = piVar9 + 4;
    } while (uVar10 != 0x10);
  }
  else {
    if (method != SCISSORINDEXEDF_V) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xc73);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar10 = 0;
    do {
      (**(code **)(lVar3 + 0x12a8))(uVar10 & 0xffffffff,piVar9);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"ScissorIndexedv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xc6f);
      uVar10 = uVar10 + 1;
      piVar9 = (int *)((long)piVar9 + 0x10);
    } while (uVar10 != 0x10);
  }
  return;
}

Assistant:

void DrawTestBase::setup4x4Scissor(SCISSOR_METHOD method, bool set_zeros)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLuint i = 0; i < 16; ++i)
	{
		gl.enablei(GL_SCISSOR_TEST, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Enablei");
	}

	GLint index = 0;
	GLint data[16 * 4 /* 4x4 * (x + y + w + h) */];

	GLint width  = m_width / 4;
	GLint height = m_height / 4;

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			data[index * 4 + 0] = x * width;
			data[index * 4 + 1] = y * height;
			if (false == set_zeros)
			{
				data[index * 4 + 2] = width;
				data[index * 4 + 3] = height;
			}
			else
			{
				data[index * 4 + 2] = 0;
				data[index * 4 + 3] = 0;
			}

			index += 1;
		}
	}

	switch (method)
	{
	case SCISSORARRAYV:
		gl.scissorArrayv(0 /* first */, 16 /*count */, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ScissorArrayv");
		break;
	case SCISSORINDEXEDF:
		for (GLuint i = 0; i < 16; ++i)
		{
			const GLint x = data[i * 4 + 0];
			const GLint y = data[i * 4 + 1];
			const GLint w = data[i * 4 + 2];
			const GLint h = data[i * 4 + 3];

			gl.scissorIndexed(i, x, y, w, h);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ScissorIndexed");
		}
		break;
	case SCISSORINDEXEDF_V:
		for (GLuint i = 0; i < 16; ++i)
		{
			gl.scissorIndexedv(i, &data[i * 4]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ScissorIndexedv");
		}
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}